

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

__pid_t __thiscall
so_5::disp::active_obj::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
::wait(dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
       *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  iterator __first;
  iterator __last;
  dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
  *this_local;
  
  __first = std::
            map<const_so_5::agent_t_*,_std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>,_std::less<const_so_5::agent_t_*>,_std::allocator<std::pair<const_so_5::agent_t_*const,_std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>_>_>_>
            ::begin(&this->m_agent_threads);
  __last = std::
           map<const_so_5::agent_t_*,_std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>,_std::less<const_so_5::agent_t_*>,_std::allocator<std::pair<const_so_5::agent_t_*const,_std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>_>_>_>
           ::end(&this->m_agent_threads);
  __std__for_each<std::_Rb_tree_iterator<std::pair<so_5::agent_t_const*const,std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>>>,void(*)(std::pair<so_5::agent_t_const*const,std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>>&)>_std___Rb_tree_iterator<std::pair<so_5::agent_t_const*const,std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>>>_std___Rb_tree_iterator<std::pair<so_5::agent_t_const*const,std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>>>_void____std__pair<so_5::agent_t_const*const,std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>>____
            ((_Rb_tree_iterator<std::pair<const_so_5::agent_t_*const,_std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>_>_>
              )__first._M_node,
             (_Rb_tree_iterator<std::pair<const_so_5::agent_t_*const,_std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>_>_>
              )__last._M_node,
             impl::(anonymous_namespace)::
             call_wait<std::pair<so_5::agent_t_const*const,std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>>>
            );
  stats::manually_registered_source_t::stop
            (&(this->m_data_source).super_manually_registered_source_t);
  return extraout_EAX;
}

Assistant:

virtual void
		wait() override
			{
				std::for_each(
					m_agent_threads.begin(),
					m_agent_threads.end(),
					call_wait< typename agent_thread_map_t::value_type > );

				m_data_source.stop();
			}